

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_ech_encode_config
              (ptls_buffer_t *buf,uint8_t config_id,ptls_hpke_kem_t *kem,ptls_iovec_t public_key,
              ptls_hpke_cipher_suite_t **ciphers,uint8_t max_name_length,char *public_name)

{
  ushort uVar1;
  uint8_t *puVar2;
  size_t sVar3;
  size_t sVar4;
  ptls_hpke_cipher_suite_t *ppVar5;
  int iVar6;
  size_t sVar7;
  size_t len;
  ulong uVar8;
  size_t sVar9;
  
  iVar6 = ptls_buffer_reserve_aligned(buf,2,'\0');
  if (iVar6 == 0) {
    puVar2 = buf->base;
    sVar3 = buf->off;
    (puVar2 + sVar3)[0] = 0xfe;
    (puVar2 + sVar3)[1] = '\r';
    buf->off = buf->off + 2;
    iVar6 = ptls_buffer_reserve_aligned(buf,2,'\0');
    if (iVar6 == 0) {
      puVar2 = buf->base;
      sVar3 = buf->off;
      (puVar2 + sVar3)[0] = '\0';
      (puVar2 + sVar3)[1] = '\0';
      sVar3 = buf->off;
      buf->off = sVar3 + 2;
      iVar6 = ptls_buffer_reserve_aligned(buf,1,'\0');
      if (iVar6 == 0) {
        buf->base[buf->off] = config_id;
        buf->off = buf->off + 1;
        uVar1 = kem->id;
        iVar6 = ptls_buffer_reserve_aligned(buf,2,'\0');
        if (iVar6 == 0) {
          *(ushort *)(buf->base + buf->off) = uVar1 << 8 | uVar1 >> 8;
          buf->off = buf->off + 2;
          iVar6 = ptls_buffer_reserve_aligned(buf,2,'\0');
          if (iVar6 == 0) {
            puVar2 = buf->base;
            sVar4 = buf->off;
            (puVar2 + sVar4)[0] = '\0';
            (puVar2 + sVar4)[1] = '\0';
            sVar4 = buf->off;
            buf->off = sVar4 + 2;
            iVar6 = ptls_buffer__do_pushv(buf,public_key.base,public_key.len);
            if (iVar6 == 0) {
              uVar8 = buf->off - (sVar4 + 2);
              iVar6 = 0x20c;
              if (uVar8 < 0x10000) {
                buf->base[sVar4] = (uint8_t)(uVar8 >> 8);
                buf->base[sVar4 + 1] = (uint8_t)uVar8;
                iVar6 = ptls_buffer_reserve_aligned(buf,2,'\0');
                if (iVar6 == 0) {
                  puVar2 = buf->base;
                  sVar4 = buf->off;
                  (puVar2 + sVar4)[0] = '\0';
                  (puVar2 + sVar4)[1] = '\0';
                  sVar9 = buf->off;
                  sVar4 = sVar9 + 2;
                  buf->off = sVar4;
                  ppVar5 = *ciphers;
                  sVar7 = sVar4;
                  while (ppVar5 != (ptls_hpke_cipher_suite_t *)0x0) {
                    uVar1 = (ppVar5->id).kdf;
                    iVar6 = ptls_buffer_reserve_aligned(buf,2,'\0');
                    if (iVar6 != 0) {
                      return iVar6;
                    }
                    *(ushort *)(buf->base + buf->off) = uVar1 << 8 | uVar1 >> 8;
                    buf->off = buf->off + 2;
                    uVar1 = ((*ciphers)->id).aead;
                    iVar6 = ptls_buffer_reserve_aligned(buf,2,'\0');
                    if (iVar6 != 0) {
                      return iVar6;
                    }
                    *(ushort *)(buf->base + buf->off) = uVar1 << 8 | uVar1 >> 8;
                    sVar7 = buf->off + 2;
                    buf->off = sVar7;
                    ppVar5 = ciphers[1];
                    ciphers = ciphers + 1;
                  }
                  uVar8 = sVar7 - sVar4;
                  if (uVar8 < 0x10000) {
                    buf->base[sVar9] = (uint8_t)(uVar8 >> 8);
                    buf->base[sVar9 + 1] = (uint8_t)uVar8;
                    iVar6 = ptls_buffer_reserve_aligned(buf,1,'\0');
                    if (iVar6 != 0) {
                      return iVar6;
                    }
                    buf->base[buf->off] = max_name_length;
                    buf->off = buf->off + 1;
                    iVar6 = ptls_buffer_reserve_aligned(buf,1,'\0');
                    if (iVar6 != 0) {
                      return iVar6;
                    }
                    buf->base[buf->off] = '\0';
                    sVar4 = buf->off;
                    sVar9 = sVar4 + 1;
                    buf->off = sVar9;
                    len = strlen(public_name);
                    iVar6 = ptls_buffer__do_pushv(buf,public_name,len);
                    if (iVar6 != 0) {
                      return iVar6;
                    }
                    uVar8 = buf->off - sVar9;
                    if (uVar8 < 0x100) {
                      buf->base[sVar4] = (uint8_t)uVar8;
                      iVar6 = ptls_buffer_reserve_aligned(buf,2,'\0');
                      if (iVar6 != 0) {
                        return iVar6;
                      }
                      puVar2 = buf->base;
                      sVar4 = buf->off;
                      (puVar2 + sVar4)[0] = '\0';
                      (puVar2 + sVar4)[1] = '\0';
                      sVar4 = buf->off;
                      buf->off = sVar4 + 2;
                      buf->base[sVar4] = '\0';
                      buf->base[sVar4 + 1] = '\0';
                      uVar8 = buf->off - (sVar3 + 2);
                      if (0xffff < uVar8) {
                        return 0x20c;
                      }
                      buf->base[sVar3] = (uint8_t)(uVar8 >> 8);
                      buf->base[sVar3 + 1] = (uint8_t)uVar8;
                      return 0;
                    }
                  }
                  iVar6 = 0x20c;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int ptls_ech_encode_config(ptls_buffer_t *buf, uint8_t config_id, ptls_hpke_kem_t *kem, ptls_iovec_t public_key,
                           ptls_hpke_cipher_suite_t **ciphers, uint8_t max_name_length, const char *public_name)
{
    int ret;

    ptls_buffer_push16(buf, PTLS_ECH_CONFIG_VERSION);
    ptls_buffer_push_block(buf, 2, {
        ptls_buffer_push(buf, config_id);
        ptls_buffer_push16(buf, kem->id);
        ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, public_key.base, public_key.len); });
        ptls_buffer_push_block(buf, 2, {
            for (size_t i = 0; ciphers[i] != NULL; ++i) {
                ptls_buffer_push16(buf, ciphers[i]->id.kdf);
                ptls_buffer_push16(buf, ciphers[i]->id.aead);
            }
        });
        ptls_buffer_push(buf, max_name_length);
        ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, public_name, strlen(public_name)); });
        ptls_buffer_push_block(buf, 2, {/* extensions */});
    });

Exit:
    return ret;
}